

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digraph.hxx
# Opt level: O3

void __thiscall
andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertAdjacenciesForEdge
          (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this,size_t edgeIndex)

{
  pointer pVVar1;
  pointer pEVar2;
  ulong uVar3;
  ulong uVar4;
  __normal_iterator<andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  _Var5;
  value_type local_40;
  
  pVVar1 = (this->vertices_).
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->edges_).
           super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = pEVar2[edgeIndex].vertexIndices_[0];
  uVar4 = pEVar2[edgeIndex].vertexIndices_[1];
  local_40.vertex_ = uVar4;
  local_40.edge_ = edgeIndex;
  _Var5 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<andres::graph::Adjacency<unsigned_long>*,std::vector<andres::graph::Adjacency<unsigned_long>,std::allocator<andres::graph::Adjacency<unsigned_long>>>>,andres::graph::Adjacency<unsigned_long>,__gnu_cxx::__ops::_Iter_comp_val<std::less<andres::graph::Adjacency<unsigned_long>>>>
                    (*(undefined8 *)
                      &pVVar1[uVar3].to_.vector_.
                       super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                     ,*(pointer *)((long)&pVVar1[uVar3].to_.vector_ + 8));
  if (((_Var5._M_current == *(pointer *)((long)&pVVar1[uVar3].to_.vector_ + 8)) ||
      (uVar4 < (_Var5._M_current)->vertex_)) ||
     ((uVar4 == (_Var5._M_current)->vertex_ && (edgeIndex < (_Var5._M_current)->edge_)))) {
    local_40.vertex_ = uVar4;
    local_40.edge_ = edgeIndex;
    std::
    vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
    ::_M_insert_rval(&pVVar1[uVar3].to_.vector_,(const_iterator)_Var5._M_current,&local_40);
  }
  pVVar1 = (this->vertices_).
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40.vertex_ = uVar3;
  local_40.edge_ = edgeIndex;
  _Var5 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<andres::graph::Adjacency<unsigned_long>*,std::vector<andres::graph::Adjacency<unsigned_long>,std::allocator<andres::graph::Adjacency<unsigned_long>>>>,andres::graph::Adjacency<unsigned_long>,__gnu_cxx::__ops::_Iter_comp_val<std::less<andres::graph::Adjacency<unsigned_long>>>>
                    (*(undefined8 *)&pVVar1[uVar4].from_.vector_,
                     *(pointer *)((long)&pVVar1[uVar4].from_.vector_ + 8));
  if (((_Var5._M_current == *(pointer *)((long)&pVVar1[uVar4].from_.vector_ + 8)) ||
      (uVar3 < (_Var5._M_current)->vertex_)) ||
     ((uVar3 == (_Var5._M_current)->vertex_ && (edgeIndex < (_Var5._M_current)->edge_)))) {
    local_40.vertex_ = uVar3;
    local_40.edge_ = edgeIndex;
    std::
    vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
    ::_M_insert_rval((vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                      *)(pVVar1 + uVar4),(const_iterator)_Var5._M_current,&local_40);
  }
  return;
}

Assistant:

inline void
Digraph<VISITOR>::insertAdjacenciesForEdge(
    const std::size_t edgeIndex
) {
    const Edge& edge = edges_[edgeIndex];
    const std::size_t vertexIndex0 = edge[0];
    const std::size_t vertexIndex1 = edge[1];
    vertices_[vertexIndex0].to_.insert(
        AdjacencyType(vertexIndex1, edgeIndex)
    );
    vertices_[vertexIndex1].from_.insert(
        AdjacencyType(vertexIndex0, edgeIndex)
    );
}